

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walkExpr(Walker *pWalker,Expr *pExpr)

{
  Select *p;
  Window *pWVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Expr *pEVar7;
  SrcList **ppSVar8;
  
  do {
    pEVar7 = pExpr;
    uVar3 = (*pWalker->xExprCallback)(pWalker,pEVar7);
    if (uVar3 != 0) {
      return uVar3 & 2;
    }
    if ((pEVar7->flags & 0x804000) != 0) {
      return 0;
    }
    if ((pEVar7->pLeft != (Expr *)0x0) && (iVar4 = walkExpr(pWalker,pEVar7->pLeft), iVar4 != 0)) {
      return 2;
    }
    pExpr = pEVar7->pRight;
  } while (pEVar7->pRight != (Expr *)0x0);
  p = (Select *)(pEVar7->x).pList;
  if ((pEVar7->flags & 0x800) == 0) {
    if (p != (Select *)0x0) {
      iVar4 = *(int *)&p->pEList;
      bVar2 = iVar4 < 1;
      if (0 < iVar4) {
        ppSVar8 = (SrcList **)&p->op;
        iVar4 = iVar4 + 1;
        do {
          if ((*ppSVar8 != (SrcList *)0x0) &&
             (iVar5 = walkExpr(pWalker,(Expr *)*ppSVar8), iVar5 != 0)) {
            if (!bVar2) {
              return 2;
            }
            break;
          }
          ppSVar8 = ppSVar8 + 4;
          iVar6 = iVar4 + -1;
          iVar5 = iVar4 + -3;
          bVar2 = iVar6 < 2;
          iVar4 = iVar6;
        } while (SBORROW4(iVar6,2) == iVar5 < 0);
      }
    }
  }
  else {
    iVar4 = sqlite3WalkSelect(pWalker,p);
    if (iVar4 != 0) {
      return 2;
    }
  }
  if ((pEVar7->flags & 0x1000000) != 0) {
    pWVar1 = (pEVar7->y).pWin;
    iVar4 = sqlite3WalkExprList(pWalker,pWVar1->pPartition);
    if (iVar4 != 0) {
      return 2;
    }
    iVar4 = sqlite3WalkExprList(pWalker,pWVar1->pOrderBy);
    if (iVar4 != 0) {
      return 2;
    }
    if ((pWVar1->pFilter != (Expr *)0x0) && (iVar4 = walkExpr(pWalker,pWVar1->pFilter), iVar4 != 0))
    {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int walkExpr(Walker *pWalker, Expr *pExpr){
  int rc;
  testcase( ExprHasProperty(pExpr, EP_TokenOnly) );
  testcase( ExprHasProperty(pExpr, EP_Reduced) );
  while(1){
    rc = pWalker->xExprCallback(pWalker, pExpr);
    if( rc ) return rc & WRC_Abort;
    if( !ExprHasProperty(pExpr,(EP_TokenOnly|EP_Leaf)) ){
      if( pExpr->pLeft && walkExpr(pWalker, pExpr->pLeft) ) return WRC_Abort;
       assert( pExpr->x.pList==0 || pExpr->pRight==0 );
      if( pExpr->pRight ){
        pExpr = pExpr->pRight;
        continue;
      }else if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        if( sqlite3WalkSelect(pWalker, pExpr->x.pSelect) ) return WRC_Abort;
      }else if( pExpr->x.pList ){
        if( sqlite3WalkExprList(pWalker, pExpr->x.pList) ) return WRC_Abort;
      }
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(pExpr, EP_WinFunc) ){
        Window *pWin = pExpr->y.pWin;
        if( sqlite3WalkExprList(pWalker, pWin->pPartition) ) return WRC_Abort;
        if( sqlite3WalkExprList(pWalker, pWin->pOrderBy) ) return WRC_Abort;
        if( sqlite3WalkExpr(pWalker, pWin->pFilter) ) return WRC_Abort;
      }
#endif
    }
    break;
  }
  return WRC_Continue;
}